

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O2

void __thiscall node::Warnings::Warnings(Warnings *this)

{
  _Rb_tree_header *p_Var1;
  long in_FS_OFFSET;
  Warning local_a4;
  bilingual_str local_a0;
  pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str> local_60;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(this->m_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_warnings)._M_t._M_impl.super__Rb_tree_header;
  (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a4 = PRE_RELEASE_TEST_BUILD;
  _(&local_a0,(ConstevalStringLiteral)0xccc17f);
  std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>::
  pair<node::Warning,_bilingual_str,_true>(&local_60,&local_a4,&local_a0);
  std::
  _Rb_tree<std::variant<kernel::Warning,node::Warning>,std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>,std::_Select1st<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>,std::less<std::variant<kernel::Warning,node::Warning>>,std::allocator<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>>
  ::_M_insert_unique<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>
            ((_Rb_tree<std::variant<kernel::Warning,node::Warning>,std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>,std::_Select1st<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>,std::less<std::variant<kernel::Warning,node::Warning>>,std::allocator<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>>
              *)&this->m_warnings,&local_60);
  bilingual_str::~bilingual_str(&local_60.second);
  bilingual_str::~bilingual_str(&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Warnings::Warnings()
{
    // Pre-release build warning
    if (!CLIENT_VERSION_IS_RELEASE) {
        m_warnings.insert(
            {Warning::PRE_RELEASE_TEST_BUILD,
             _("This is a pre-release test build - use at your own risk - do not use for mining or merchant applications")});
    }
}